

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O3

int calc_active_worst_quality_no_stats_cbr(AV1_COMP *cpi)

{
  int iVar1;
  AV1_PRIMARY *pAVar2;
  LAYER_CONTEXT *pLVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  
  if (((cpi->common).current_frame.frame_type & 0xfd) == 0) {
    return (cpi->rc).worst_quality;
  }
  pAVar2 = cpi->ppi;
  iVar8 = (cpi->svc).number_temporal_layers;
  if (iVar8 < 2) {
    iVar7 = (pAVar2->p_rc).avg_frame_qindex[0];
  }
  else {
    pLVar3 = (cpi->svc).layer_context;
    iVar9 = (pLVar3->p_rc).avg_frame_qindex[0];
    iVar7 = (pLVar3->p_rc).last_q[0];
    if (iVar9 < iVar7) {
      iVar7 = iVar9;
    }
  }
  uVar4 = (pAVar2->p_rc).optimal_buffer_level;
  if (((((cpi->svc).temporal_layer_id < 1) ||
       (iVar9 = iVar7, iVar8 * 2 <= (cpi->rc).frames_since_key)) &&
      (iVar1 = (pAVar2->p_rc).avg_frame_qindex[1], iVar9 = iVar1,
      (cpi->common).current_frame.frame_number < (uint)(iVar8 * 5))) &&
     (iVar9 = iVar7, iVar1 < iVar7)) {
    iVar9 = iVar1;
  }
  iVar8 = (cpi->rc).worst_quality;
  if (iVar8 < iVar9) {
    iVar9 = iVar8;
  }
  lVar5 = (pAVar2->p_rc).buffer_level;
  if (lVar5 - uVar4 == 0 || lVar5 < (long)uVar4) {
    if (lVar5 <= (long)uVar4 >> 3) {
      return iVar8;
    }
    if (uVar4 < 8) {
      return iVar9;
    }
    iVar7 = 0;
    lVar6 = uVar4 - ((long)uVar4 >> 3);
    if (lVar6 != 0) {
      iVar7 = (int)((long)((uVar4 - lVar5) * (long)(iVar8 - iVar9)) / lVar6);
    }
    return iVar7 + iVar9;
  }
  if ((((cpi->oxcf).q_cfg.aq_mode == '\x03') && (pAVar2->use_svc == 0)) &&
     ((cpi->oxcf).tune_cfg.content == AOM_CONTENT_SCREEN)) {
    iVar7 = iVar9 + 0xf;
    if (-1 < iVar9) {
      iVar7 = iVar9;
    }
    iVar8 = 4;
    if (0x4f < iVar9) goto LAB_0021478a;
    iVar8 = iVar7 >> 4;
  }
  else {
    iVar7 = iVar9 * 5 + 3;
    if (-1 < iVar9 * 5) {
      iVar7 = iVar9 * 5;
    }
    iVar9 = iVar7 >> 2;
    if (iVar8 < iVar7 >> 2) {
      iVar9 = iVar8;
    }
    iVar8 = iVar9 / 3;
  }
  if (iVar8 == 0) {
    return iVar9;
  }
LAB_0021478a:
  lVar6 = (long)((pAVar2->p_rc).maximum_buffer_size - uVar4) / (long)iVar8;
  if (lVar6 == 0) {
    iVar8 = 0;
  }
  else {
    iVar8 = (int)((long)(lVar5 - uVar4) / lVar6);
  }
  return iVar9 - iVar8;
}

Assistant:

static inline int frame_is_intra_only(const AV1_COMMON *const cm) {
  return cm->current_frame.frame_type == KEY_FRAME ||
         cm->current_frame.frame_type == INTRA_ONLY_FRAME;
}